

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.h
# Opt level: O2

void __thiscall
GrcErrorList::AddWarning(GrcErrorList *this,int nID,GdlObject *pgdlobj,string *staMsg)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)staMsg);
  AddItem(this,false,nID,pgdlobj,(GrpLineAndFile *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void AddWarning(int nID, GdlObject * pgdlobj, std::string staMsg)
	{
		AddItem(false, nID, pgdlobj, NULL, staMsg);
	}